

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::clear(table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this)

{
  size_t sVar1;
  group_type_pointer pgVar2;
  pointer p;
  uint uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong uVar5;
  ulong uVar6;
  group_type_pointer pgVar7;
  uint uVar8;
  value_type_pointer ppVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  
  ppVar9 = (this->arrays).elements_;
  if (ppVar9 != (value_type_pointer)0x0) {
    sVar1 = (this->arrays).groups_size_mask;
    pgVar2 = (this->arrays).groups_;
    if (pgVar2 != pgVar2 + sVar1 + 1) {
      pgVar7 = pgVar2;
      do {
        auVar11[0] = -(pgVar7->m[0].n == '\0');
        auVar11[1] = -(pgVar7->m[1].n == '\0');
        auVar11[2] = -(pgVar7->m[2].n == '\0');
        auVar11[3] = -(pgVar7->m[3].n == '\0');
        auVar11[4] = -(pgVar7->m[4].n == '\0');
        auVar11[5] = -(pgVar7->m[5].n == '\0');
        auVar11[6] = -(pgVar7->m[6].n == '\0');
        auVar11[7] = -(pgVar7->m[7].n == '\0');
        auVar11[8] = -(pgVar7->m[8].n == '\0');
        auVar11[9] = -(pgVar7->m[9].n == '\0');
        auVar11[10] = -(pgVar7->m[10].n == '\0');
        auVar11[0xb] = -(pgVar7->m[0xb].n == '\0');
        auVar11[0xc] = -(pgVar7->m[0xc].n == '\0');
        auVar11[0xd] = -(pgVar7->m[0xd].n == '\0');
        auVar11[0xe] = -(pgVar7->m[0xe].n == '\0');
        auVar11[0xf] = -(pgVar7->m[0xf].n == '\0');
        for (uVar8 = ((uint)(pgVar2 + sVar1 != pgVar7) << 0xe | 0x3fff) &
                     ~(uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(auVar11[0xf] >> 7) << 0xf); uVar8 != 0;
            uVar8 = uVar8 - 1 & uVar8) {
          uVar3 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          paVar4 = &ppVar9[uVar3].second.field_2;
          p = ppVar9[uVar3].second._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p != paVar4) {
            operator_delete(p,paVar4->_M_allocated_capacity + 1);
          }
        }
        pgVar7->m[0].n = (undefined1  [16])0x0;
        ppVar9 = ppVar9 + 0xf;
        bVar10 = pgVar7 != pgVar2 + sVar1;
        pgVar7 = pgVar7 + 1;
      } while (bVar10);
    }
    (this->arrays).groups_[(this->arrays).groups_size_mask].m[0xe].n = '\x01';
    uVar5 = (this->arrays).groups_size_mask * 0xf + 0xe;
    if ((this->arrays).elements_ == (value_type_pointer)0x0) {
      uVar5 = 0;
    }
    uVar6 = (ulong)((float)uVar5 * 0.875);
    uVar6 = (long)((float)uVar5 * 0.875 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6;
    if (uVar5 < 0x1e) {
      uVar6 = uVar5;
    }
    (this->size_ctrl).ml = uVar6;
    (this->size_ctrl).size = 0;
  }
  return;
}

Assistant:

group_type* groups() const noexcept { return std::to_address(groups_); }